

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O0

stumpless_param * stumpless_load_param(stumpless_param *param,char *name,char *value)

{
  _Bool _Var1;
  size_t local_30;
  size_t name_length;
  char *value_local;
  char *name_local;
  stumpless_param *param_local;
  
  name_length = (size_t)value;
  value_local = name;
  name_local = param->name;
  if (param == (stumpless_param *)0x0) {
    raise_argument_empty("param was NULL");
    param_local = (stumpless_param *)0x0;
  }
  else if (name == (char *)0x0) {
    raise_argument_empty("name was NULL");
    param_local = (stumpless_param *)0x0;
  }
  else if (value == (char *)0x0) {
    raise_argument_empty("value was NULL");
    param_local = (stumpless_param *)0x0;
  }
  else {
    _Var1 = validate_param_name(name,&local_30);
    if (_Var1) {
      clear_error();
      param_local = unchecked_load_param
                              ((stumpless_param *)name_local,value_local,local_30,
                               (char *)name_length);
    }
    else {
      param_local = (stumpless_param *)0x0;
    }
  }
  return param_local;
}

Assistant:

struct stumpless_param *
stumpless_load_param( struct stumpless_param *param,
                      const char *name,
                      const char *value ) {
  size_t name_length;

  VALIDATE_ARG_NOT_NULL( param );
  VALIDATE_ARG_NOT_NULL( name );
  VALIDATE_ARG_NOT_NULL( value );

  if( unlikely( !validate_param_name( name, &name_length ) ) ) {
    return NULL;
  }

  clear_error(  );
  return unchecked_load_param( param, name, name_length, value );
}